

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherical_micro_batcher.hpp
# Opt level: O3

void __thiscall
IntegratorXX::
SphericalMicroBatcher<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
::
SphericalMicroBatcher<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,IntegratorXX::LebedevLaikov<double>>,void>
          (SphericalMicroBatcher<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
           *this,size_t batch_size,
          SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_IntegratorXX::LebedevLaikov<double>_>
          *quad)

{
  undefined1 local_39;
  SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_IntegratorXX::LebedevLaikov<double>_>
  *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>_>
  local_28;
  
  local_38 = (SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_IntegratorXX::LebedevLaikov<double>_>
              *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,IntegratorXX::LebedevLaikov<double>>,std::allocator<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,IntegratorXX::LebedevLaikov<double>>>,IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,IntegratorXX::LebedevLaikov<double>>const&>
            (&_Stack_30,&local_38,
             (allocator<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_IntegratorXX::LebedevLaikov<double>_>_>
              *)&local_39,quad);
  local_28.
  super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = &local_38->
             super_SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  ;
  local_28.
  super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Stack_30._M_pi;
  local_38 = (SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_IntegratorXX::LebedevLaikov<double>_>
              *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  SphericalMicroBatcher<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  ::SphericalMicroBatcher
            ((SphericalMicroBatcher<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
              *)this,batch_size,&local_28);
  if (local_28.
      super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.
               super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  return;
}

Assistant:

SphericalMicroBatcher( size_t batch_size, const Quad& quad ):
    SphericalMicroBatcher( 
      batch_size, 
      std::make_shared<Quad>( quad ) 
    ) { }